

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dump.cpp
# Opt level: O0

void Utils::hexDump(FastString *out,uint8 *array,uint32 length,uint32 colSize,bool withAddress,
                   bool withCharVal)

{
  uint local_c4;
  uint local_a0;
  String local_88;
  uint local_78;
  uint local_74;
  uint32 j_1;
  uint32 k;
  String local_60 [2];
  String local_40;
  uint local_2c;
  uint local_28;
  uint32 j;
  uint32 i;
  bool withCharVal_local;
  uint32 uStack_1c;
  bool withAddress_local;
  uint32 colSize_local;
  uint32 length_local;
  uint8 *array_local;
  FastString *out_local;
  
  j._2_1_ = withCharVal;
  j._3_1_ = withAddress;
  i = colSize;
  uStack_1c = length;
  _colSize_local = array;
  array_local = (uint8 *)out;
  for (local_28 = 0; local_28 < uStack_1c; local_28 = local_28 + 1) {
    if (local_28 % i == 0) {
      if (((j._2_1_ & 1) != 0) && (local_28 != 0)) {
        Bstrlib::String::operator+=((String *)array_local," ");
        for (local_2c = local_28 - i; local_2c < local_28; local_2c = local_2c + 1) {
          if ((_colSize_local[local_2c] < 0x20) || (0x7f < _colSize_local[local_2c])) {
            local_a0 = 0x2e;
          }
          else {
            local_a0 = (uint)_colSize_local[local_2c];
          }
          Bstrlib::String::Print((char *)&local_40,"%c",(ulong)local_a0);
          Bstrlib::String::operator+=((String *)array_local,&local_40);
          Bstrlib::String::~String(&local_40);
        }
      }
      Bstrlib::String::operator+=((String *)array_local,"\n");
      if ((j._3_1_ & 1) != 0) {
        Bstrlib::String::Print((char *)local_60,"%08X ",(ulong)local_28);
        Bstrlib::String::operator+=((String *)array_local,local_60);
        Bstrlib::String::~String(local_60);
      }
    }
    Bstrlib::String::Print((char *)&j_1,"%02X ",(ulong)_colSize_local[local_28]);
    Bstrlib::String::operator+=((String *)array_local,(String *)&j_1);
    Bstrlib::String::~String((String *)&j_1);
  }
  if (((j._2_1_ & 1) != 0) && (local_28 != 0)) {
    for (local_74 = 0; local_74 < i - local_28 % i; local_74 = local_74 + 1) {
      Bstrlib::String::operator+=((String *)array_local,"   ");
    }
    Bstrlib::String::operator+=((String *)array_local," ");
    for (local_78 = local_28 - local_28 % i; local_78 < local_28; local_78 = local_78 + 1) {
      if ((_colSize_local[local_78] < 0x20) || (0x7f < _colSize_local[local_78])) {
        local_c4 = 0x2e;
      }
      else {
        local_c4 = (uint)_colSize_local[local_78];
      }
      Bstrlib::String::Print((char *)&local_88,"%c",(ulong)local_c4);
      Bstrlib::String::operator+=((String *)array_local,&local_88);
      Bstrlib::String::~String(&local_88);
    }
  }
  return;
}

Assistant:

void hexDump(Strings::FastString & out, const uint8 * const array, const uint32 length, const uint32 colSize, const bool withAddress, const bool withCharVal)
    {
        uint32 i = 0;
        for (; i < length; i++)
        {
            if ((i % colSize) == 0)
            {
                // Output the charVal if any present
                if (withCharVal && i)
                {
                    out += " ";
                    for (uint32 j = i - colSize; j < i; j++)
                    {
                        out += Strings::FastString::Print("%c", (array[j] < 32 || array[j] >= 0x80) ? '.' : array[j]);
                    }
                }

                out += "\n";
                if (withAddress)
                    out += Strings::FastString::Print("%08X ", i);

            }
            out += Strings::FastString::Print("%02X ", (unsigned int)array[i]);
        }
        // Output the charVal if any present
        if (withCharVal && i)
        {
            for (uint32 k = 0; k < colSize - (i % colSize); k++)
                out += "   ";

            out += " ";
            for (uint32 j = i - (i % colSize); j < i; j++)
            {
                out += Strings::FastString::Print("%c", (array[j] < 32 || array[j] >= 0x80) ? '.' : array[j]);
            }
        }
    }